

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void compact_with_snapshot_open_multi_kvs_test(void)

{
  fdb_status fVar1;
  cb_args cb_args;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status s;
  fdb_kvs_handle *db5;
  fdb_kvs_handle *db4;
  fdb_kvs_handle *db3;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db1;
  fdb_file_handle *dbfile;
  char bodybuf [256];
  char keybuf [256];
  int n;
  int r;
  int j;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffb98;
  fdb_file_handle *in_stack_fffffffffffffba0;
  size_t in_stack_fffffffffffffbb8;
  fdb_file_handle *in_stack_fffffffffffffbc0;
  size_t in_stack_fffffffffffffbc8;
  char *in_stack_fffffffffffffbd0;
  fdb_kvs_handle *in_stack_fffffffffffffbd8;
  int local_3c8 [16];
  undefined8 local_388;
  undefined4 local_374;
  code *local_340;
  undefined4 local_338;
  int *local_330;
  fdb_kvs_config *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  fdb_kvs_handle **in_stack_fffffffffffffd50;
  fdb_file_handle *in_stack_fffffffffffffd58;
  fdb_kvs_handle *local_288;
  size_t local_280;
  fdb_file_handle *local_278;
  char local_268 [32];
  fdb_config *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  fdb_file_handle **in_stack_fffffffffffffdc8;
  fdb_file_handle local_168 [6];
  int local_60;
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_60 = 1000;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  memset(local_3c8,0,0x18);
  local_388 = 0x400;
  local_374 = 1;
  local_340 = compaction_cb_markers;
  local_330 = local_3c8;
  local_338 = 0x1b;
  local_5c = system("rm -rf  compact_test* > errorlog.txt");
  fdb_open(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  fdb_kvs_open(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               in_stack_fffffffffffffd40);
  fdb_kvs_open(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               in_stack_fffffffffffffd40);
  fdb_kvs_open(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               in_stack_fffffffffffffd40);
  fdb_kvs_open(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               in_stack_fffffffffffffd40);
  fdb_kvs_open(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               in_stack_fffffffffffffd40);
  local_58 = 0;
  do {
    if (4 < local_58) {
      fVar1 = fdb_close(in_stack_fffffffffffffb98);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xc7d);
        compact_with_snapshot_open_multi_kvs_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xc7d,"void compact_with_snapshot_open_multi_kvs_test()");
        }
      }
      fVar1 = fdb_shutdown();
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xc7f);
        compact_with_snapshot_open_multi_kvs_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xc7f,"void compact_with_snapshot_open_multi_kvs_test()");
        }
      }
      if (compact_with_snapshot_open_multi_kvs_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","compact with snapshot_open multi kvs test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","compact with snapshot_open multi kvs test");
      }
      return;
    }
    for (local_54 = 0; (int)local_54 < local_60; local_54 = local_54 + 1) {
      sprintf((char *)local_168,"key%04d",(ulong)local_54);
      sprintf(local_268,"body%04d",(ulong)local_54);
      in_stack_fffffffffffffba0 = local_168;
      in_stack_fffffffffffffb98 = local_278;
      strlen((char *)local_168);
      strlen(local_268);
      fdb_set_kv(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                 in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      in_stack_fffffffffffffbc0 = local_168;
      in_stack_fffffffffffffbb8 = local_280;
      in_stack_fffffffffffffbc8 = strlen((char *)local_168);
      in_stack_fffffffffffffbd0 = local_268;
      strlen(local_268);
      fdb_set_kv(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                 in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      in_stack_fffffffffffffbd8 = local_288;
      strlen((char *)local_168);
      strlen(local_268);
      fdb_set_kv(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                 in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      strlen((char *)local_168);
      strlen(local_268);
      fdb_set_kv(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                 in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      strlen((char *)local_168);
      strlen(local_268);
      fdb_set_kv(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                 in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    }
    fVar1 = fdb_commit(in_stack_fffffffffffffb98,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xc74);
      compact_with_snapshot_open_multi_kvs_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xc74,"void compact_with_snapshot_open_multi_kvs_test()");
      }
    }
    local_3c8[0] = local_60 * (local_58 + 1);
    fVar1 = fdb_compact(in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xc79);
      compact_with_snapshot_open_multi_kvs_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xc79,"void compact_with_snapshot_open_multi_kvs_test()");
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

void compact_with_snapshot_open_multi_kvs_test()
{
    TEST_INIT();
    memleak_start();

    int i, j, r;
    int n = 1000;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db1, *db2, *db3, *db4, *db5;
    fdb_status s;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    struct cb_args cb_args;

    memset(&cb_args, 0x0, sizeof(struct cb_args));

    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_cb = compaction_cb_markers;
    fconfig.compaction_cb_ctx = &cb_args;
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_MOVE_DOC |
                                 FDB_CS_FLUSH_WAL |
                                 FDB_CS_END;

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open two handles for kvs
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db1, "db1", &kvs_config);
    fdb_kvs_open(dbfile, &db2, "db2", &kvs_config);
    fdb_kvs_open(dbfile, &db3, "db3", &kvs_config);
    fdb_kvs_open(dbfile, &db4, "db4", &kvs_config);
    fdb_kvs_open(dbfile, &db5, "db5", &kvs_config);
    for (j=0;j<5;++j){
        for (i=0;i<n;++i){
            sprintf(keybuf, "key%04d", i);
            sprintf(bodybuf, "body%04d", i);
            fdb_set_kv(db1, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db2, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db3, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db4, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db5, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        }

        // commit
        s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // compact
        cb_args.n_moved_docs = n*(j+1);
        s = fdb_compact(dbfile, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_RESULT("compact with snapshot_open multi kvs test");
}